

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

Node * __thiscall llvm::yaml::KeyValueNode::getValue(KeyValueNode *this)

{
  bool bVar1;
  Node *pNVar2;
  BumpPtrAllocator *pBVar3;
  KeyValueNode *pKVar4;
  Token *pTVar5;
  KeyValueNode *local_b8;
  KeyValueNode *local_a8;
  KeyValueNode *local_98;
  KeyValueNode *local_88;
  Token *t;
  Twine local_38;
  Token *local_20;
  Token *t_1;
  KeyValueNode *this_local;
  
  if (this->Value == (Node *)0x0) {
    t_1 = (Token *)this;
    pNVar2 = getKey(this);
    (*pNVar2->_vptr_Node[1])();
    bVar1 = Node::failed(&this->super_Node);
    if (bVar1) {
      pBVar3 = Node::getAllocator(&this->super_Node);
      pKVar4 = (KeyValueNode *)Node::operator_new(0x48,pBVar3,0x10);
      local_88 = (KeyValueNode *)0x0;
      if (pKVar4 != (KeyValueNode *)0x0) {
        NullNode::NullNode((NullNode *)pKVar4,(this->super_Node).Doc);
        local_88 = pKVar4;
      }
      this->Value = &local_88->super_Node;
      this_local = local_88;
    }
    else {
      local_20 = Node::peekNext(&this->super_Node);
      if ((((local_20->Kind == TK_BlockEnd) || (local_20->Kind == TK_FlowMappingEnd)) ||
          (local_20->Kind == TK_Key)) ||
         ((local_20->Kind == TK_FlowEntry || (local_20->Kind == TK_Error)))) {
        pBVar3 = Node::getAllocator(&this->super_Node);
        pKVar4 = (KeyValueNode *)Node::operator_new(0x48,pBVar3,0x10);
        local_98 = (KeyValueNode *)0x0;
        if (pKVar4 != (KeyValueNode *)0x0) {
          NullNode::NullNode((NullNode *)pKVar4,(this->super_Node).Doc);
          local_98 = pKVar4;
        }
        this->Value = &local_98->super_Node;
        this_local = local_98;
      }
      else if (local_20->Kind == TK_Value) {
        Node::getNext((Token *)&t,&this->super_Node);
        Token::~Token((Token *)&t);
        pTVar5 = Node::peekNext(&this->super_Node);
        if ((pTVar5->Kind == TK_BlockEnd) || (pTVar5->Kind == TK_Key)) {
          pBVar3 = Node::getAllocator(&this->super_Node);
          pKVar4 = (KeyValueNode *)Node::operator_new(0x48,pBVar3,0x10);
          local_b8 = (KeyValueNode *)0x0;
          if (pKVar4 != (KeyValueNode *)0x0) {
            NullNode::NullNode((NullNode *)pKVar4,(this->super_Node).Doc);
            local_b8 = pKVar4;
          }
          this->Value = &local_b8->super_Node;
          this_local = local_b8;
        }
        else {
          this_local = (KeyValueNode *)Node::parseBlockNode(&this->super_Node);
          this->Value = (Node *)this_local;
        }
      }
      else {
        Twine::Twine(&local_38,"Unexpected token in Key Value.");
        Node::setError(&this->super_Node,&local_38,local_20);
        pBVar3 = Node::getAllocator(&this->super_Node);
        pKVar4 = (KeyValueNode *)Node::operator_new(0x48,pBVar3,0x10);
        local_a8 = (KeyValueNode *)0x0;
        if (pKVar4 != (KeyValueNode *)0x0) {
          NullNode::NullNode((NullNode *)pKVar4,(this->super_Node).Doc);
          local_a8 = pKVar4;
        }
        this->Value = &local_a8->super_Node;
        this_local = local_a8;
      }
    }
  }
  else {
    this_local = (KeyValueNode *)this->Value;
  }
  return &this_local->super_Node;
}

Assistant:

Node *KeyValueNode::getValue() {
  if (Value)
    return Value;
  getKey()->skip();
  if (failed())
    return Value = new (getAllocator()) NullNode(Doc);

  // Handle implicit null values.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_FlowMappingEnd
        || t.Kind == Token::TK_Key
        || t.Kind == Token::TK_FlowEntry
        || t.Kind == Token::TK_Error) {
      return Value = new (getAllocator()) NullNode(Doc);
    }

    if (t.Kind != Token::TK_Value) {
      setError("Unexpected token in Key Value.", t);
      return Value = new (getAllocator()) NullNode(Doc);
    }
    getNext(); // skip TK_Value.
  }

  // Handle explicit null values.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Key) {
    return Value = new (getAllocator()) NullNode(Doc);
  }

  // We got a normal value.
  return Value = parseBlockNode();
}